

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::StoreComponentOfValueToAccessChainToScalarVar
          (InterfaceVariableScalarReplacement *this,uint32_t value_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *component_indices,
          Instruction *scalar_var,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *access_chain_indices,
          Instruction *insert_before)

{
  bool bVar1;
  Instruction *local_48;
  Instruction *ptr;
  Instruction *pIStack_38;
  uint32_t component_type_id;
  Instruction *insert_before_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *access_chain_indices_local;
  Instruction *scalar_var_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *component_indices_local;
  InterfaceVariableScalarReplacement *pIStack_10;
  uint32_t value_id_local;
  InterfaceVariableScalarReplacement *this_local;
  
  pIStack_38 = insert_before;
  insert_before_local = (Instruction *)access_chain_indices;
  access_chain_indices_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)scalar_var;
  scalar_var_local = (Instruction *)component_indices;
  component_indices_local._4_4_ = value_id;
  pIStack_10 = this;
  ptr._4_4_ = GetPointeeTypeIdOfVar(this,scalar_var);
  local_48 = (Instruction *)access_chain_indices_local;
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)insert_before_local);
  if (!bVar1) {
    local_48 = CreateAccessChainToVar
                         (this,ptr._4_4_,(Instruction *)access_chain_indices_local,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)insert_before_local
                          ,pIStack_38,(uint32_t *)((long)&ptr + 4));
  }
  StoreComponentOfValueTo
            (this,ptr._4_4_,component_indices_local._4_4_,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)scalar_var_local,local_48,
             (uint32_t *)0x0,pIStack_38);
  return;
}

Assistant:

void InterfaceVariableScalarReplacement::
    StoreComponentOfValueToAccessChainToScalarVar(
        uint32_t value_id, const std::vector<uint32_t>& component_indices,
        Instruction* scalar_var,
        const std::vector<uint32_t>& access_chain_indices,
        Instruction* insert_before) {
  uint32_t component_type_id = GetPointeeTypeIdOfVar(scalar_var);
  Instruction* ptr = scalar_var;
  if (!access_chain_indices.empty()) {
    ptr = CreateAccessChainToVar(component_type_id, scalar_var,
                                 access_chain_indices, insert_before,
                                 &component_type_id);
  }

  StoreComponentOfValueTo(component_type_id, value_id, component_indices, ptr,
                          nullptr, insert_before);
}